

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void load_variable(ch_compilation *comp,ch_lexeme name)

{
  ch_scope *scope;
  uint8_t uVar1;
  _Bool _Var2;
  undefined4 in_EAX;
  ch_dataptr value;
  size_t write_size;
  ch_emit_scope *blob;
  undefined4 uStack_28;
  uint8_t offset;
  ch_op op;
  
  scope = comp->scope;
  uStack_28 = in_EAX;
  _Var2 = scope_lookup(scope,name,&offset);
  if (_Var2) {
    _uStack_28 = CONCAT44(0x11,uStack_28);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
    value = (ch_dataptr)offset;
  }
  else {
    _Var2 = upvalue_lookup(comp,scope,name,&offset);
    if (_Var2) {
      _uStack_28 = CONCAT44(0x13,uStack_28);
      write_size = 1;
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
      uVar1 = offset;
      _uStack_28 = CONCAT14(uVar1,uStack_28);
      blob = (comp->emit).emit_scope;
      goto LAB_00103e9f;
    }
    _uStack_28 = CONCAT44(0x18,uStack_28);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op,1);
    value = emit_string(comp,name.start,name.size);
  }
  ch_uint32_to_le_array(value,(uint8_t *)&op);
  blob = (comp->emit).emit_scope;
  write_size = 4;
LAB_00103e9f:
  ch_emit_write(&blob->bytecode,&op,write_size);
  return;
}

Assistant:

void load_variable(ch_compilation *comp, ch_lexeme name) {
  uint8_t offset;

  if (scope_lookup(comp->scope, name, &offset)) {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_LOCAL);
    EMIT_PTR(GET_EMIT(comp), offset);
  } else if(upvalue_lookup(comp, comp->scope, name, &offset)) {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_UPVALUE);
    EMIT_ARGCOUNT(GET_EMIT(comp), offset);
  } else {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_GLOBAL);
    ch_dataptr string_ptr = emit_string(comp, name.start, name.size);
    EMIT_PTR(GET_EMIT(comp), string_ptr);
  }
}